

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printBranchOperand(MCInst *MI,uint OpNo,SStream *O)

{
  _Bool _Var1;
  MCOperand *op;
  uint in_ESI;
  MCInst *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  uint OpNo_00;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  OpNo_00 = (uint)((ulong)in_RDI >> 0x20);
  _Var1 = MCOperand_isImm(op);
  if (_Var1) {
    printAbsBranchOperand((MCInst *)O,OpNo_00,(SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0))
    ;
  }
  else {
    printOperand(MI,OpNo,O);
  }
  return;
}

Assistant:

static void printBranchOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	if (!MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		printOperand(MI, OpNo, O);
		return;
	}

	// Branches can take an immediate operand.  This is used by the branch
	// selection pass to print .+8, an eight byte displacement from the PC.
	printAbsBranchOperand(MI, OpNo, O);
}